

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmh.h
# Opt level: O2

size_t __thiscall
frozen::bits::pmh_tables<8ul,frozen::elsa<void>>::
lookup<frozen::basic_string<char>,frozen::elsa<void>>
          (pmh_tables<8ul,frozen::elsa<void>> *this,basic_string<char> *key,elsa<void> *hasher)

{
  size_t sVar1;
  
  sVar1 = elsa<void>::operator()(hasher,key,*(size_t *)this);
  sVar1 = *(size_t *)(this + (ulong)((uint)sVar1 & 7) * 8 + 8);
  if ((long)sVar1 < 0) {
    sVar1 = elsa<void>::operator()(hasher,key,sVar1);
    sVar1 = *(size_t *)(this + (ulong)((uint)sVar1 & 7) * 8 + 0x48);
  }
  return sVar1;
}

Assistant:

constexpr std::size_t lookup(const KeyType & key, const HasherType& hasher) const {
    auto const d = first_table_[hasher(key, static_cast<std::size_t>(first_seed_)) % M];
    if (!d.is_seed()) { return static_cast<std::size_t>(d.value()); } // this is narrowing std::uint64 -> std::size_t but should be fine
    else { return second_table_[hasher(key, static_cast<std::size_t>(d.value())) % M]; }
  }